

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall
pbrt::SceneEntity::SceneEntity
          (SceneEntity *this,string *name,ParameterDictionary parameters,FileLoc loc)

{
  ParameterDictionary *in_RDX;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  ParameterDictionary::ParameterDictionary(&this->parameters,in_RDX);
  *(ParsedParameter **)&(this->loc).line = parameters.params.field_2.fixed[0];
  (this->loc).filename._M_len = (size_t)parameters.params.alloc.memoryResource;
  (this->loc).filename._M_str = (char *)parameters.params.ptr;
  return;
}

Assistant:

SceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc)
        : name(name), parameters(parameters), loc(loc) {}